

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O2

void __thiscall
duckdb::UncompressedStringSegmentState::RegisterBlock
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  iterator iVar1;
  InternalException *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar2;
  block_id_t block_id_local;
  shared_ptr<duckdb::BlockHandle,_true> result;
  string local_50;
  
  block_id_local = block_id;
  ::std::mutex::lock(&this->block_lock);
  iVar1 = ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->handles)._M_h,&block_id_local);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((this->block_manager).ptr != (BlockManager *)0x0) {
      manager_p = optional_ptr<duckdb::BlockManager,_true>::operator*(&this->block_manager);
    }
    sVar2 = BlockManager::RegisterBlock((BlockManager *)&result,(block_id_t)manager_p);
    local_50._M_dataplus._M_p = (pointer)block_id_local;
    local_50._M_string_length =
         (size_type)
         result.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.field_2._M_allocated_capacity =
         (size_type)
         result.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    result.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    result.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
              ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->handles,&local_50,
               sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.field_2._M_allocated_capacity
              );
    ::std::vector<long,_std::allocator<long>_>::push_back
              (&(this->on_disk_blocks).super_vector<long,_std::allocator<long>_>,&block_id_local);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&result.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "UncompressedStringSegmentState::RegisterBlock - block id %llu already exists",
             (allocator *)&result);
  InternalException::InternalException<long>(this_00,&local_50,block_id_local);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void UncompressedStringSegmentState::RegisterBlock(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		throw InternalException("UncompressedStringSegmentState::RegisterBlock - block id %llu already exists",
		                        block_id);
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, std::move(result)));
	on_disk_blocks.push_back(block_id);
}